

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImFontGlyph_resizeT(ImVector_ImFontGlyph *self,int new_size,ImFontGlyph v)

{
  ImVector<ImFontGlyph>::resize(self,new_size,&v);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_resizeT(ImVector_ImFontGlyph* self,int new_size,const ImFontGlyph v)
{
    return self->resize(new_size,v);
}